

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint *puVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  FileDescriptor *pFVar8;
  DescriptorPool *pDVar9;
  DescriptorPool *pDVar10;
  MessageFactory *pMVar11;
  undefined4 extraout_var;
  TypeInfo *this_00;
  OneofDescriptor *pOVar12;
  ulong uVar13;
  FieldDescriptor *pFVar14;
  type puVar15;
  int *piVar16;
  char *pcVar17;
  DynamicMessage *this_01;
  unique_ptr<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
  *this_02;
  Reflection *this_03;
  int __c;
  DescriptorPool *local_100;
  undefined1 local_e0 [8];
  ReflectionSchema schema;
  DynamicMessage *prototype;
  void *base;
  FieldDescriptor *field;
  int local_80;
  int j_1;
  int i_4;
  int i_3;
  int field_size;
  int i_2;
  int has_bits_array_size;
  int j;
  uint32_t *has_bits_indices;
  uint local_58;
  int i_1;
  int max_hasbit;
  int size;
  uint32_t *offsets;
  int local_40;
  int i;
  int real_oneof_count;
  TypeInfo *local_30;
  TypeInfo *type_info;
  TypeInfo **target;
  Descriptor *type_local;
  DynamicMessageFactory *this_local;
  
  target = (TypeInfo **)type;
  type_local = (Descriptor *)this;
  if ((this->delegate_to_generated_factory_ & 1U) != 0) {
    pFVar8 = Descriptor::file(type);
    pDVar9 = FileDescriptor::pool(pFVar8);
    pDVar10 = DescriptorPool::generated_pool();
    if (pDVar9 == pDVar10) {
      pMVar11 = MessageFactory::generated_factory();
      iVar5 = (*pMVar11->_vptr_MessageFactory[2])(pMVar11,target);
      return (Message *)CONCAT44(extraout_var,iVar5);
    }
  }
  type_info = (TypeInfo *)
              std::
              unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
              ::operator[](&this->prototypes_,(key_type *)&target);
  if (*(mapped_type *)type_info == (mapped_type)0x0) {
    this_00 = (TypeInfo *)operator_new(0x50);
    TypeInfo::TypeInfo(this_00);
    *(TypeInfo **)type_info = this_00;
    this_00->type = (Descriptor *)target;
    local_30 = this_00;
    if (this->pool_ == (DescriptorPool *)0x0) {
      pFVar8 = Descriptor::file((Descriptor *)target);
      local_100 = FileDescriptor::pool(pFVar8);
    }
    else {
      local_100 = this->pool_;
    }
    local_30->pool = local_100;
    local_30->factory = this;
    local_40 = 0;
    for (offsets._4_4_ = 0; iVar5 = offsets._4_4_,
        iVar6 = Descriptor::oneof_decl_count((Descriptor *)target), iVar5 < iVar6;
        offsets._4_4_ = offsets._4_4_ + 1) {
      pOVar12 = Descriptor::oneof_decl((Descriptor *)target,offsets._4_4_);
      bVar4 = OneofDescriptor::is_synthetic(pOVar12);
      if (!bVar4) {
        local_40 = local_40 + 1;
      }
    }
    iVar5 = Descriptor::field_count((Descriptor *)target);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(iVar5 + local_40);
    uVar13 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    _max_hasbit = (uint *)operator_new__(uVar13);
    std::unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>>::reset<unsigned_int*,void>
              ((unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>> *)&local_30->offsets,
               _max_hasbit);
    i_1 = 0x20;
    i_1 = anon_unknown_0::AlignOffset(0x20);
    local_30->has_bits_offset = -1;
    local_58 = 0;
    for (has_bits_indices._4_4_ = 0; iVar5 = has_bits_indices._4_4_,
        iVar6 = Descriptor::field_count((Descriptor *)target), iVar5 < iVar6;
        has_bits_indices._4_4_ = has_bits_indices._4_4_ + 1) {
      pFVar14 = Descriptor::field((Descriptor *)target,has_bits_indices._4_4_);
      bVar4 = anon_unknown_0::HasHasbit(pFVar14);
      if (bVar4) {
        if (local_30->has_bits_offset == -1) {
          local_30->has_bits_offset = i_1;
          iVar5 = Descriptor::field_count((Descriptor *)target);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (long)iVar5;
          uVar13 = SUB168(auVar2 * ZEXT816(4),0);
          if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
            uVar13 = 0xffffffffffffffff;
          }
          _has_bits_array_size = (uint *)operator_new__(uVar13);
          for (i_2 = 0; iVar5 = i_2, iVar6 = Descriptor::field_count((Descriptor *)target),
              iVar5 < iVar6; i_2 = i_2 + 1) {
            _has_bits_array_size[i_2] = 0xffffffff;
          }
          std::unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>>::
          reset<unsigned_int*,void>
                    ((unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>> *)
                     &local_30->has_bits_indices,_has_bits_array_size);
        }
        uVar7 = local_58;
        local_58 = local_58 + 1;
        puVar15 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                            (&local_30->has_bits_indices,(long)has_bits_indices._4_4_);
        *puVar15 = uVar7;
      }
    }
    if (0 < (int)local_58) {
      field_size = anon_unknown_0::DivideRoundingUp(local_58,0x20);
      i_1 = i_1 + field_size * 4;
      i_1 = anon_unknown_0::AlignOffset(i_1);
    }
    if (0 < local_40) {
      local_30->oneof_case_offset = i_1;
      i_1 = i_1 + local_40 * 4;
      i_1 = anon_unknown_0::AlignOffset(i_1);
    }
    iVar5 = Descriptor::extension_range_count((Descriptor *)target);
    if (iVar5 < 1) {
      local_30->extensions_offset = -1;
    }
    else {
      local_30->extensions_offset = i_1;
      i_1 = i_1 + 0x18;
      i_1 = anon_unknown_0::AlignOffset(i_1);
    }
    for (i_3 = 0; iVar5 = i_3, iVar6 = Descriptor::field_count((Descriptor *)target), iVar5 < iVar6;
        i_3 = i_3 + 1) {
      pFVar14 = Descriptor::field((Descriptor *)target,i_3);
      bVar4 = anon_unknown_0::InRealOneof(pFVar14);
      if (!bVar4) {
        pFVar14 = Descriptor::field((Descriptor *)target,i_3);
        i_4 = anon_unknown_0::FieldSpaceUsed(pFVar14);
        iVar5 = i_1;
        piVar16 = std::min<int>(&(anonymous_namespace)::kSafeAlignment,&i_4);
        uVar7 = anon_unknown_0::AlignTo(iVar5,*piVar16);
        _max_hasbit[i_3] = uVar7;
        i_1 = i_4 + uVar7;
      }
    }
    for (j_1 = 0; iVar5 = Descriptor::oneof_decl_count((Descriptor *)target), j_1 < iVar5;
        j_1 = j_1 + 1) {
      pOVar12 = Descriptor::oneof_decl((Descriptor *)target,j_1);
      bVar4 = OneofDescriptor::is_synthetic(pOVar12);
      if (!bVar4) {
        uVar7 = anon_unknown_0::AlignTo(i_1,8);
        puVar3 = _max_hasbit;
        i_1 = uVar7;
        iVar5 = Descriptor::field_count((Descriptor *)target);
        puVar3[iVar5 + j_1] = uVar7;
        i_1 = i_1 + 8;
      }
    }
    local_30->weak_field_map_offset = -1;
    local_30->size = i_1;
    for (local_80 = 0; iVar5 = Descriptor::oneof_decl_count((Descriptor *)target), local_80 < iVar5;
        local_80 = local_80 + 1) {
      pOVar12 = Descriptor::oneof_decl((Descriptor *)target,local_80);
      bVar4 = OneofDescriptor::is_synthetic(pOVar12);
      if (!bVar4) {
        field._4_4_ = 0;
        while( true ) {
          pOVar12 = Descriptor::oneof_decl((Descriptor *)target,local_80);
          iVar5 = OneofDescriptor::field_count(pOVar12);
          if (iVar5 <= (int)field._4_4_) break;
          pOVar12 = Descriptor::oneof_decl((Descriptor *)target,local_80);
          pcVar17 = (char *)(ulong)field._4_4_;
          pFVar14 = OneofDescriptor::field(pOVar12,field._4_4_);
          puVar3 = _max_hasbit;
          pcVar17 = FieldDescriptor::index(pFVar14,pcVar17,__c);
          puVar3[(int)pcVar17] = 0x40000000;
          field._4_4_ = field._4_4_ + 1;
        }
      }
    }
    this_01 = (DynamicMessage *)operator_new((long)i_1);
    memset(this_01,0,(long)i_1);
    DynamicMessage::DynamicMessage(this_01,local_30,false);
    local_e0 = (undefined1  [8])local_30->prototype;
    schema._56_8_ = this_01;
    schema.default_instance_ =
         (Message *)
         std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
                   (&local_30->offsets);
    schema.offsets_ =
         std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
                   (&local_30->has_bits_indices);
    schema.has_bit_indices_._0_4_ = local_30->has_bits_offset;
    schema.has_bit_indices_._4_4_ = 8;
    schema.has_bits_offset_ = local_30->extensions_offset;
    schema.metadata_offset_ = local_30->oneof_case_offset;
    schema.extensions_offset_ = local_30->size;
    schema.oneof_case_offset_ = local_30->weak_field_map_offset;
    schema.object_size_ = 0;
    schema.weak_field_map_offset_ = 0;
    schema.inlined_string_indices_._0_4_ = 0;
    this_02 = &local_30->reflection;
    this_03 = (Reflection *)operator_new(0x60);
    Reflection::Reflection
              (this_03,local_30->type,(ReflectionSchema *)local_e0,local_30->pool,
               &this->super_MessageFactory);
    std::
    unique_ptr<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
    ::reset(this_02,this_03);
    DynamicMessage::CrossLinkPrototypes((DynamicMessage *)schema._56_8_);
    this_local = (DynamicMessageFactory *)schema._56_8_;
  }
  else {
    this_local = (DynamicMessageFactory *)(*(mapped_type *)type_info)->prototype;
  }
  return (Message *)this_local;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    return MessageFactory::generated_factory()->GetPrototype(type);
  }

  const TypeInfo** target = &prototypes_[type];
  if (*target != nullptr) {
    // Already exists.
    return (*target)->prototype;
  }

  TypeInfo* type_info = new TypeInfo;
  *target = type_info;

  type_info->type = type;
  type_info->pool = (pool_ == nullptr) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to Reflection's constructor.
  // This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.
  int real_oneof_count = 0;
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    if (!type->oneof_decl(i)->is_synthetic()) {
      real_oneof_count++;
    }
  }

  // Compute size and offsets.
  uint32_t* offsets = new uint32_t[type->field_count() + real_oneof_count];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  type_info->has_bits_offset = -1;
  int max_hasbit = 0;
  for (int i = 0; i < type->field_count(); i++) {
    if (HasHasbit(type->field(i))) {
      if (type_info->has_bits_offset == -1) {
        // At least one field in the message requires a hasbit, so allocate
        // hasbits.
        type_info->has_bits_offset = size;
        uint32_t* has_bits_indices = new uint32_t[type->field_count()];
        for (int j = 0; j < type->field_count(); j++) {
          // Initialize to -1, fields that need a hasbit will overwrite.
          has_bits_indices[j] = static_cast<uint32_t>(-1);
        }
        type_info->has_bits_indices.reset(has_bits_indices);
      }
      type_info->has_bits_indices[i] = max_hasbit++;
    }
  }

  if (max_hasbit > 0) {
    int has_bits_array_size = DivideRoundingUp(max_hasbit, bitsizeof(uint32_t));
    size += has_bits_array_size * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The oneof_case, if any. It is an array of uint32s.
  if (real_oneof_count > 0) {
    type_info->oneof_case_offset = size;
    size += real_oneof_count * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  //
  // TODO(b/31226269):  Optimize the order of fields to minimize padding.
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    // Oneof fields do not use any space.
    if (!InRealOneof(type->field(i))) {
      int field_size = FieldSpaceUsed(type->field(i));
      size = AlignTo(size, std::min(kSafeAlignment, field_size));
      offsets[i] = size;
      size += field_size;
    }
  }

  // The oneofs.
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    if (!type->oneof_decl(i)->is_synthetic()) {
      size = AlignTo(size, kSafeAlignment);
      offsets[type->field_count() + i] = size;
      size += kMaxOneofUnionSize;
    }
  }

  type_info->weak_field_map_offset = -1;

  // Align the final size to make sure no clever allocators think that
  // alignment is not necessary.
  type_info->size = size;

  // Construct the reflection object.

  // Compute the size of default oneof instance and offsets of default
  // oneof fields.
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    if (type->oneof_decl(i)->is_synthetic()) continue;
    for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->oneof_decl(i)->field(j);
      // oneof fields are not accessed through offsets, but we still have the
      // entry from a legacy implementation. This should be removed at some
      // point.
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      offsets[field->index()] = internal::kInvalidFieldOffsetTag;
    }
  }

  // Allocate the prototype fields.
  void* base = operator new(size);
  memset(base, 0, size);

  // We have already locked the factory so we should not lock in the constructor
  // of dynamic message to avoid dead lock.
  DynamicMessage* prototype = new (base) DynamicMessage(type_info, false);

  internal::ReflectionSchema schema = {
      type_info->prototype,
      type_info->offsets.get(),
      type_info->has_bits_indices.get(),
      type_info->has_bits_offset,
      PROTOBUF_FIELD_OFFSET(DynamicMessage, _internal_metadata_),
      type_info->extensions_offset,
      type_info->oneof_case_offset,
      type_info->size,
      type_info->weak_field_map_offset,
      nullptr /* inlined_string_indices_ */,
      0 /* inlined_string_donated_offset_ */};

  type_info->reflection.reset(
      new Reflection(type_info->type, schema, type_info->pool, this));

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}